

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenSteerDemo.cpp
# Opt level: O1

void OpenSteer::OpenSteerDemo::popPhase(void)

{
  long lVar1;
  float fVar2;
  
  fVar2 = Clock::realTimeSinceFirstClockUpdate(&clock);
  phaseTimers[phase] = (fVar2 - phaseTimerBase) + phaseTimers[phase];
  phaseTimerBase = fVar2;
  lVar1 = (long)phaseStackIndex;
  phaseStackIndex = phaseStackIndex + -1;
  phase = (&phaseStackIndex)[lVar1];
  updatePhaseActive = phase == 1;
  drawPhaseActive = phase == 2;
  return;
}

Assistant:

void 
OpenSteer::OpenSteerDemo::popPhase (void)
{
    // update timer for current (old) phase: add in time since last switch
    updatePhaseTimers ();

    // restore old phase
    phase = phaseStack[--phaseStackIndex];
    updatePhaseActive = phase == OpenSteer::OpenSteerDemo::updatePhase;
    drawPhaseActive = phase == OpenSteer::OpenSteerDemo::drawPhase;
}